

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phyr_reporter.h
# Opt level: O1

void __thiscall phyr::ProgressReporter::endReport(ProgressReporter *this,string *p_token)

{
  size_t __n;
  int iVar1;
  undefined8 *puVar2;
  char *pcVar3;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  if (this->state == ACQUIRED) {
    __n = (this->token)._M_string_length;
    if ((__n == p_token->_M_string_length) &&
       ((__n == 0 ||
        (iVar1 = bcmp((this->token)._M_dataplus._M_p,(p_token->_M_dataplus)._M_p,__n), iVar1 == 0)))
       ) {
      Timer::resetTimer((this->timer)._M_t.
                        super___uniq_ptr_impl<phyr::Timer,_std::default_delete<phyr::Timer>_>._M_t.
                        super__Tuple_impl<0UL,_phyr::Timer_*,_std::default_delete<phyr::Timer>_>.
                        super__Head_base<0UL,_phyr::Timer_*,_false>._M_head_impl);
      this->state = AVAILABLE;
      local_40 = 0;
      local_38[0] = 0;
      local_48 = local_38;
      std::__cxx11::string::operator=((string *)&this->token,(string *)&local_48);
      if (local_48 != local_38) {
        operator_delete(local_48);
      }
      showProgress(this);
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_001ada88;
    pcVar3 = "Invalid access token";
  }
  else {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_001ada88;
    pcVar3 = "Invalid ProgressReporter state";
  }
  puVar2[1] = pcVar3;
  __cxa_throw(puVar2,&ProgressReporterException::typeinfo,std::exception::~exception);
}

Assistant:

void endReport(const std::string& p_token) {
        if (state == ProgressReporterStates::ACQUIRED && token == p_token) {
            timer->resetTimer();
            state = ProgressReporterStates::AVAILABLE;
            token = std::string();

            // Last call to {showProgress()} to make sure
            // progress has been shown to 100%
            showProgress();
        } else {
            if (state != ProgressReporterStates::ACQUIRED)
                throw ProgressReporterException("Invalid ProgressReporter state");
            else
                throw ProgressReporterException("Invalid access token");
        }
    }